

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ef7149::HighBDConvolveScaleTest::SetUp(HighBDConvolveScaleTest *this)

{
  int iVar1;
  undefined4 uVar2;
  _Tuple_impl<0UL,_int,_int> _Var3;
  undefined4 uVar4;
  uint uVar5;
  ParamType *pPVar6;
  ParamType *pPVar7;
  TestImage<unsigned_short> *pTVar8;
  SEARCH_METHODS *message;
  AssertHelper AStack_48;
  Message local_40;
  AssertionResult gtest_ar;
  
  pPVar6 = testing::
           WithParamInterface<std::tuple<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>_>
           ::GetParam();
  this->tst_fun_ =
       (HighbdConvolveFunc)
       (pPVar6->
       super__Tuple_impl<0UL,_void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>
       ).
       super__Head_base<0UL,_void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_false>
       ._M_head_impl;
  pPVar6 = testing::
           WithParamInterface<std::tuple<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>_>
           ::GetParam();
  pPVar7 = testing::
           WithParamInterface<std::tuple<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>_>
           ::GetParam();
  iVar1 = (pPVar7->
          super__Tuple_impl<0UL,_void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>
          ).super__Tuple_impl<1UL,_std::tuple<int,_int>,_int>.super__Tuple_impl<2UL,_int>.
          super__Head_base<2UL,_int,_false>._M_head_impl;
  _Var3 = (pPVar6->
          super__Tuple_impl<0UL,_void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>
          ).super__Tuple_impl<1UL,_std::tuple<int,_int>,_int>.
          super__Head_base<1UL,_std::tuple<int,_int>,_false>._M_head_impl.
          super__Tuple_impl<0UL,_int,_int>;
  (this->super_ConvolveScaleTestBase<unsigned_short>).width_ =
       _Var3.super__Head_base<0UL,_int,_false>._M_head_impl._M_head_impl;
  (this->super_ConvolveScaleTestBase<unsigned_short>).height_ =
       (int)_Var3.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl.
            super__Head_base<1UL,_int,_false>;
  (this->super_ConvolveScaleTestBase<unsigned_short>).bd_ = iVar1;
  pTVar8 = (this->super_ConvolveScaleTestBase<unsigned_short>).image_;
  if (pTVar8 != (TestImage<unsigned_short> *)0x0) {
    TestImage<unsigned_short>::~TestImage(pTVar8);
  }
  operator_delete(pTVar8);
  pTVar8 = (TestImage<unsigned_short> *)operator_new(0x60);
  iVar1 = (this->super_ConvolveScaleTestBase<unsigned_short>).width_;
  pTVar8->w_ = iVar1;
  uVar2 = (this->super_ConvolveScaleTestBase<unsigned_short>).height_;
  uVar4 = (this->super_ConvolveScaleTestBase<unsigned_short>).bd_;
  pTVar8->h_ = uVar2;
  pTVar8->bd_ = uVar4;
  uVar5 = iVar1 + 0x4fU & 0xfffffff0;
  (pTVar8->dst_16_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar8->dst_16_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar8->dst_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar8->dst_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pTVar8->src_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pTVar8->dst_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar8->dst_16_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pTVar8->src_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar8->src_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar8->src_stride_ = uVar5;
  pTVar8->dst_stride_ = uVar5 + 0x10;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&pTVar8->src_data_,(long)(int)((uVar2 + 0x40) * uVar5 * 2));
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&pTVar8->dst_data_,(long)((pTVar8->h_ + 0x40) * pTVar8->dst_stride_ * 2));
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&pTVar8->dst_16_data_,(long)((pTVar8->h_ + 0x40) * pTVar8->dst_stride_ * 2));
  (this->super_ConvolveScaleTestBase<unsigned_short>).image_ = pTVar8;
  testing::AssertionSuccess();
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_40);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(SEARCH_METHODS **)
                 gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_convolve_scale_test.cc"
               ,0xcf,(char *)message);
    testing::internal::AssertHelper::operator=(&AStack_48,&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_40.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_40.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void SetUp() override {
    tst_fun_ = GET_PARAM(0);

    const BlockDimension &block = GET_PARAM(1);
    const int bd = GET_PARAM(2);

    SetParams(BaseParams(block), bd);
  }